

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.h
# Opt level: O0

void FileUtil::output_latent_factors
               (string *output_file,value_type_conflict1 *data,int obj_num,int dim)

{
  ostream *poVar1;
  void *this;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  _Ios_Openmode in_EDI;
  int d;
  int obj_id;
  ofstream fout;
  int local_22c;
  int local_228;
  string local_218 [512];
  int local_18;
  int local_14;
  long local_10;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,in_EDI);
  for (local_228 = 0; local_228 < local_14; local_228 = local_228 + 1) {
    for (local_22c = 0; local_22c < local_18 + -1; local_22c = local_22c + 1) {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (local_218,
                          *(double *)(local_10 + (long)(local_22c * local_14 + local_228) * 8));
      std::operator<<(poVar1,",");
    }
    this = (void *)std::ostream::operator<<
                             (local_218,
                              *(double *)(local_10 + (long)(local_18 * local_14 + local_228) * 8));
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void output_latent_factors(const string output_file, const value_type *data, const int obj_num, const int dim){
        // input is column-wise but output will be row-wise
        ofstream fout;
        fout.open(output_file);

        for (int obj_id = 0; obj_id < obj_num; obj_id++) {
            for (int d = 0; d < dim - 1; d++) {
                fout << data[d * obj_num + obj_id] << ",";
            }
            fout << data[dim * obj_num + obj_id] << endl;
        }

        fout.close();
    }